

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cpp
# Opt level: O3

Image * __thiscall teetime::Image::operator=(Image *this,Image *rhs)

{
  size_t sVar1;
  
  reset(this);
  sVar1 = rhs->m_height;
  this->m_width = rhs->m_width;
  this->m_height = sVar1;
  this->m_data = rhs->m_data;
  std::__cxx11::string::operator=((string *)&this->m_filename,(string *)&rhs->m_filename);
  rhs->m_width = 0;
  rhs->m_height = 0;
  rhs->m_data = (Rgba *)0x0;
  return this;
}

Assistant:

const Image& Image::operator =(Image&& rhs)
{
  reset();

  m_width = rhs.m_width;
  m_height = rhs.m_height;
  m_data = rhs.m_data;
  m_filename = std::move(rhs.m_filename);

  rhs.m_width = 0;
  rhs.m_height = 0;
  rhs.m_data = nullptr;

  return *this;
}